

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O1

void __thiscall
chrono::ChFrame<double>::SetCoord
          (ChFrame<double> *this,ChVector<double> *mv,ChQuaternion<double> *mq)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  if (&this->coord != (ChCoordsys<double> *)mv) {
    (this->coord).pos.m_data[0] = mv->m_data[0];
    (this->coord).pos.m_data[1] = mv->m_data[1];
    (this->coord).pos.m_data[2] = mv->m_data[2];
  }
  if (&(this->coord).rot != mq) {
    (this->coord).rot.m_data[0] = mq->m_data[0];
    (this->coord).rot.m_data[1] = mq->m_data[1];
    (this->coord).rot.m_data[2] = mq->m_data[2];
    (this->coord).rot.m_data[3] = mq->m_data[3];
  }
  dVar1 = mq->m_data[0];
  dVar2 = mq->m_data[1];
  dVar5 = dVar1 * dVar1;
  dVar3 = mq->m_data[2];
  dVar4 = mq->m_data[3];
  auVar10 = ZEXT816(0xbff0000000000000);
  auVar11 = ZEXT816(0x4000000000000000);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar5 + dVar2 * dVar2;
  auVar7 = vfmadd213sd_fma(auVar9,auVar11,auVar10);
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar7._0_8_;
  dVar6 = dVar2 * dVar3 - dVar1 * dVar4;
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       dVar6 + dVar6;
  dVar6 = dVar1 * dVar3 + dVar2 * dVar4;
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       dVar6 + dVar6;
  dVar6 = dVar2 * dVar3 + dVar1 * dVar4;
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       dVar6 + dVar6;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar5 + dVar3 * dVar3;
  auVar7 = vfmadd213sd_fma(auVar7,auVar11,auVar10);
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar7._0_8_;
  dVar6 = dVar3 * dVar4 - dVar1 * dVar2;
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       dVar6 + dVar6;
  dVar6 = dVar2 * dVar4 - dVar1 * dVar3;
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       dVar6 + dVar6;
  dVar1 = dVar1 * dVar2 + dVar3 * dVar4;
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       dVar1 + dVar1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar5 + dVar4 * dVar4;
  auVar7 = vfmadd213sd_fma(auVar8,auVar11,auVar10);
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar7._0_8_;
  return;
}

Assistant:

void SetCoord(const ChVector<Real>& mv, const ChQuaternion<Real>& mq) {
        coord.pos = mv;
        coord.rot = mq;
        Amatrix.Set_A_quaternion(mq);
    }